

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O0

void __thiscall ThreadPool::ThreadPool(ThreadPool *this,size_t threads)

{
  ulong in_RSI;
  vector<std::thread,_std::allocator<std::thread>_> *in_RDI;
  size_t i;
  condition_variable *this_00;
  __integral_type __i;
  queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  *in_stack_ffffffffffffffb0;
  pointer *this_01;
  vector<std::thread,_std::allocator<std::thread>_> *this_02;
  ulong local_28;
  
  this_02 = in_RDI;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x1850d5);
  std::
  queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
  ::queue<std::deque<std::function<void()>,std::allocator<std::function<void()>>>,void>
            (in_stack_ffffffffffffffb0);
  std::mutex::mutex((mutex *)0x1850f8);
  this_00 = (condition_variable *)(in_RDI + 6);
  std::condition_variable::condition_variable(this_00);
  __i = (__integral_type)((ulong)this_00 >> 0x20);
  std::mutex::mutex((mutex *)0x18511e);
  this_01 = &in_RDI[9].super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::condition_variable::condition_variable((condition_variable *)this_01);
  *(undefined1 *)
   &in_RDI[0xb].super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  std::atomic<int>::atomic((atomic<int> *)this_01,__i);
  for (local_28 = 0; local_28 < in_RSI; local_28 = local_28 + 1) {
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<ThreadPool::ThreadPool(unsigned_long)::_lambda()_1_>(this_02,(type *)in_RDI);
  }
  return;
}

Assistant:

inline ThreadPool::ThreadPool(size_t threads)
    : stop(false) {
  for(size_t i = 0; i<threads; ++i)
    workers.emplace_back(
      [this]
      {
        for(;;) {
          std::function<void()> task;
          {
            std::unique_lock<std::mutex> lock(this->queue_mutex);
            this->condition.wait(lock,
              [this]{ return this->stop || !this->tasks.empty(); });
            if (this->stop && this->tasks.empty()) {
              return;
            }
            task = std::move(this->tasks.front());
            this->tasks.pop();
          }
          task();
          {
            std::unique_lock<std::mutex> lock(this->sync_mutex);
            sync++;
            sync_condition.notify_one();
          }
       }
     }
   );
}